

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O1

void __thiscall
pstack::Procman::ProcessLocation::ProcessLocation(ProcessLocation *this,Process *proc,Addr address_)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  CodeLocation *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  unsigned_long local_90;
  tuple<unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*> local_88;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  CodeLocation *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined1 auStack_48 [8];
  sptr dwarf;
  undefined1 local_29;
  
  (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Process::findSegment(&local_88,proc,address_);
  if (local_88.
      super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
      .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
      super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
      super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    auStack_48 = (undefined1  [8])0x0;
    dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_68 = local_88.
               super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
               .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
               super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
               super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_60 = local_88.
               super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
               .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
               super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
               super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_88.
        super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
        .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
        super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
        super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_88.
         super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
         .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
         super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
         super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_88.
                        super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                        .
                        super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                        .super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>.
                        _M_head_impl.
                        super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_88.
         super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
         .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
         super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
         super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_88.
                        super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                        .
                        super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                        .super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>.
                        _M_head_impl.
                        super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Process::getDwarf((Process *)auStack_48,(sptr *)proc);
  }
  if ((local_88.
       super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
       .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
       super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
       super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) && (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (auStack_48 == (undefined1  [8])0x0) {
    _Var2._M_pi = (this->codeloc).
                  super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_90 = address_ -
               local_88.
               super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
               .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    local_58 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pstack::Procman::CodeLocation,std::allocator<pstack::Procman::CodeLocation>,std::shared_ptr<pstack::Dwarf::Info>&,Elf64_Phdr_const*&,unsigned_long>
              (&_Stack_50,&local_58,(allocator<pstack::Procman::CodeLocation> *)&local_29,
               (shared_ptr<pstack::Dwarf::Info> *)auStack_48,(Elf64_Phdr **)&local_88,&local_90);
    _Var2._M_pi = _Stack_50._M_pi;
    pCVar1 = local_58;
    local_58 = (CodeLocation *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->codeloc).
              super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pCVar1;
    (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    _Var2._M_pi = _Stack_50._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var2._M_pi = _Stack_50._M_pi;
    }
  }
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
  }
  this->location_ = address_;
  if (dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (local_88.
      super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
      .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
      super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
      super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.
               super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
               .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
               super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
               super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return;
}

Assistant:

ProcessLocation::ProcessLocation(Process &proc, Elf::Addr address_) {
    auto [ elfReloc, elf, phdr ] = proc.findSegment(address_);
    auto dwarf = elf ? proc.getDwarf(elf) : nullptr;
    if (dwarf) {
        codeloc = std::make_shared<CodeLocation>(dwarf, phdr, address_ - elfReloc);
    } else {
        codeloc = nullptr;
    }
    location_ = address_;
}